

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Temporary.cpp
# Opt level: O0

void __thiscall IRT::Temporary::Temporary(Temporary *this)

{
  int __val;
  string local_30;
  Temporary *local_10;
  Temporary *this_local;
  
  __val = counter_;
  counter_ = counter_ + 1;
  local_10 = this;
  std::__cxx11::to_string(&local_30,__val);
  std::operator+(&this->name_,"%",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

IRT::Temporary::Temporary(): name_("%" + std::to_string(counter_++)) {

}